

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldStateTest_SwapRepeatedDirty_Test::TestBody
          (MapFieldStateTest_SwapRepeatedDirty_Test *this)

{
  State SVar1;
  State state;
  int map_size;
  int in_R8D;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  other;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  local_20;
  
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::ArenaHolder(&local_20,
                (this->super_MapFieldStateTest).arena_._M_t.
                super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
                .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl);
  MapFieldStateTest::MakeRepeatedDirty(&this->super_MapFieldStateTest,local_20.field_);
  MapFieldBase::Swap((MapFieldBase *)(this->super_MapFieldStateTest).map_field_.field_,
                     (MapFieldBase *)local_20.field_);
  map_size = 1;
  MapFieldStateTest::Expect
            ((MapFieldStateTest *)(this->super_MapFieldStateTest).map_field_.field_,
             (MapFieldType *)0x2,CLEAN,1,in_R8D);
  SVar1 = (this->super_MapFieldStateTest).state_;
  if (SVar1 == CLEAN) {
LAB_0074891c:
    state = MAP_DIRTY;
  }
  else {
    if (SVar1 == MAP_DIRTY) {
      map_size = 0;
      goto LAB_0074891c;
    }
    if (SVar1 != REPEATED_DIRTY) goto LAB_0074892d;
    state = CLEAN;
  }
  MapFieldStateTest::Expect
            ((MapFieldStateTest *)local_20.field_,(MapFieldType *)(ulong)SVar1,state,map_size,in_R8D
            );
LAB_0074892d:
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder(&local_20);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, SwapRepeatedDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeRepeatedDirty(other.get());

  map_field_->Swap(other.get());

  Expect(map_field_.get(), REPEATED_DIRTY, 0, 1);

  switch (state_) {
    case CLEAN:
      Expect(other.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(other.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(other.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}